

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  char *pcVar1;
  void *ttf_data;
  size_t sVar2;
  char *pcVar3;
  ImFont *pIVar4;
  long lVar5;
  ImFontConfig *pIVar6;
  byte bVar7;
  int data_size;
  ImFontConfig font_cfg;
  int local_a4;
  ImFontConfig local_a0;
  
  bVar7 = 0;
  local_a4 = 0;
  ttf_data = ImFileLoadToMemory(filename,"rb",&local_a4,0);
  if (ttf_data == (void *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x4f6,
                  "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_a0.FontData = (void *)0x0;
    local_a0.FontDataSize = 0;
    local_a0.GlyphExtraSpacing.x = 0.0;
    local_a0.GlyphExtraSpacing.y = 0.0;
    local_a0.GlyphOffset.x = 0.0;
    local_a0.GlyphOffset.y = 0.0;
    local_a0.FontDataOwnedByAtlas = true;
    local_a0.FontNo = 0;
    local_a0.SizePixels = 0.0;
    local_a0.OversampleH = 3;
    local_a0.OversampleV = 1;
    local_a0.PixelSnapH = false;
    local_a0.GlyphRanges = (ImWchar *)0x0;
    local_a0.MergeMode = false;
    local_a0.RasterizerFlags = 0;
    local_a0.RasterizerMultiply = 1.0;
    local_a0.Name[0] = '\0';
    local_a0.Name[1] = '\0';
    local_a0.Name[2] = '\0';
    local_a0.Name[3] = '\0';
    local_a0.Name[4] = '\0';
    local_a0.Name[5] = '\0';
    local_a0.Name[6] = '\0';
    local_a0.Name[7] = '\0';
    local_a0.Name[8] = '\0';
    local_a0.Name[9] = '\0';
    local_a0.Name[10] = '\0';
    local_a0.Name[0xb] = '\0';
    local_a0.Name[0xc] = '\0';
    local_a0.Name[0xd] = '\0';
    local_a0.Name[0xe] = '\0';
    local_a0.Name[0xf] = '\0';
    local_a0.Name[0x10] = '\0';
    local_a0.Name[0x11] = '\0';
    local_a0.Name[0x12] = '\0';
    local_a0.Name[0x13] = '\0';
    local_a0.Name[0x14] = '\0';
    local_a0.Name[0x15] = '\0';
    local_a0.Name[0x16] = '\0';
    local_a0.Name[0x17] = '\0';
    local_a0.Name[0x18] = '\0';
    local_a0.Name[0x19] = '\0';
    local_a0.Name[0x1a] = '\0';
    local_a0.Name[0x1b] = '\0';
    local_a0.Name[0x1c] = '\0';
    local_a0.Name[0x1d] = '\0';
    local_a0.Name[0x1e] = '\0';
    local_a0.Name[0x1f] = '\0';
    local_a0.DstFont = (ImFont *)0x0;
  }
  else {
    pIVar6 = &local_a0;
    for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
      pIVar6->FontData = font_cfg_template->FontData;
      font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar7 * -0x10 + 8);
      pIVar6 = (ImFontConfig *)((long)pIVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
  }
  if (local_a0.Name[0] == '\0') {
    sVar2 = strlen(filename);
    pcVar3 = filename + sVar2;
    do {
      if ((pcVar3 <= filename) || (pcVar1 = pcVar3 + -1, *pcVar1 == '\\')) break;
      pcVar3 = pcVar3 + -1;
    } while (*pcVar1 != '/');
    snprintf(local_a0.Name,0x20,"%s, %.0fpx",SUB84((double)size_pixels,0));
  }
  pIVar4 = AddFontFromMemoryTTF(this,ttf_data,local_a4,size_pixels,&local_a0,glyph_ranges);
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    int data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT(0); // Could not load file.
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        snprintf(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, data_size, size_pixels, &font_cfg, glyph_ranges);
}